

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::computeTensorWeights
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,MultiIndexSet *mset)

{
  uint uVar1;
  size_t sVar2;
  pointer piVar3;
  pointer piVar4;
  uint *puVar5;
  bool bVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> *weights;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  size_type __n;
  int iVar17;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  Data2D<int> dag_down;
  allocator_type local_a5;
  value_type_conflict3 local_a4;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  ulong local_58;
  size_type local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  sVar2 = mset->num_dimensions;
  __n = (size_type)mset->cache_num_indexes;
  iVar17 = (int)sVar2;
  if (iVar17 == 1) {
    local_58 = local_58 & 0xffffffff00000000;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,__n,
               (value_type_conflict3 *)&local_58,(allocator_type *)&local_98);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1] = 1;
  }
  else {
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    resortIndexes(mset,&local_98,&local_78);
    local_58 = (ulong)iVar17;
    local_50 = __n;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_48,local_58 * __n,(allocator_type *)&local_a4);
    local_a4 = 0;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,__n,&local_a4,&local_a5);
    lVar7 = (long)((sVar2 << 0x20) + -0x100000000) >> 0x20;
    piVar3 = local_78.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar7].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (int)((ulong)((long)local_78.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
    if (0 < (int)uVar10) {
      piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        lVar7 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        piVar4[(long)piVar3[lVar7] + -1] = 1;
      } while (uVar10 != uVar11);
    }
    if (1 < iVar17) {
      uVar11 = (ulong)(iVar17 - 2);
      do {
        puVar5 = (uint *)local_78.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        uVar10 = (int)((ulong)((long)local_78.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)puVar5) >> 2) - 1;
        if (0 < (int)uVar10) {
          piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = 0;
          uVar14 = (ulong)*puVar5;
          do {
            uVar13 = uVar12 + 1;
            uVar1 = puVar5[uVar12 + 1];
            uVar15 = (ulong)uVar1;
            if ((int)uVar14 <= (int)(uVar1 - 2)) {
              lVar8 = (long)(int)uVar1;
              piVar3 = local_98.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar11].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              lVar7 = lVar8 + -2;
              do {
                lVar8 = lVar8 + -1;
                if (lVar7 + 1 < (long)(int)uVar15) {
                  iVar17 = piVar3[lVar7];
                  iVar9 = piVar4[iVar17];
                  lVar16 = lVar8;
                  do {
                    iVar9 = iVar9 - piVar4[piVar3[lVar16]];
                    piVar4[iVar17] = iVar9;
                    lVar16 = lVar16 + 1;
                    uVar15 = (ulong)(int)puVar5[uVar13];
                  } while (lVar16 < (long)uVar15);
                }
                bVar6 = (int)puVar5[uVar12] < lVar7;
                lVar7 = lVar7 + -1;
              } while (bVar6);
            }
            uVar12 = uVar13;
            uVar14 = uVar15;
          } while (uVar13 != uVar10);
        }
        bVar6 = 0 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar6);
    }
    local_a0 = __return_storage_ptr__;
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_78);
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_98);
    __return_storage_ptr__ = local_a0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> computeTensorWeights(MultiIndexSet const &mset){
    int num_dimensions = mset.getNumDimensions();
    int num_tensors = mset.getNumIndexes();

    if (num_dimensions == 1) {
        std::vector<int> weights(num_tensors, 0);
        weights.back() = 1;
        return weights;
    }

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;

    resortIndexes(mset, map, lines1d);

    Data2D<int> dag_down(num_dimensions, num_tensors);

    std::vector<int> weights(num_tensors, 0);

    // the row with contiguous indexes has a trivial solution
    auto const& last_jobs = lines1d[num_dimensions-1];
    for(int i=0; i<static_cast<int>(last_jobs.size() - 1); i++)
        weights[last_jobs[i+1] - 1] = 1;

    for(int d=num_dimensions-2; d>=0; d--) {
        #pragma omp parallel for
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job+1]-2; i>=lines1d[d][job]; i--) {
                int &val = weights[map[d][i]];
                for(int j=i+1; j<lines1d[d][job+1]; j++) {
                    val -= weights[map[d][j]];
                }
            }
        }
    }

    return weights;
}